

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCircBufferedStream.cpp
# Opt level: O3

void __thiscall
TPZCircBufferedStream::WriteToBuffer(TPZCircBufferedStream *this,char *source,size_t *nBytes)

{
  size_t __n;
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  size_t oldSize;
  size_t local_38;
  
  local_38 = this->fSize;
  __n = *nBytes;
  if (this->fNAllocatedBytes < __n + local_38) {
    auVar6._8_4_ = (int)(local_38 >> 0x20);
    auVar6._0_8_ = local_38;
    auVar6._12_4_ = 0x45300000;
    auVar7._8_4_ = (int)(__n >> 0x20);
    auVar7._0_8_ = __n;
    auVar7._12_4_ = 0x45300000;
    dVar8 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)local_38) - 4503599627370496.0)) * 1.1 +
            (auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)__n) - 4503599627370496.0) + 1.0;
    uVar2 = (ulong)dVar8;
    uVar2 = (long)(dVar8 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
    pcVar3 = (char *)operator_new__(uVar2);
    (*(this->super_TPZStream)._vptr_TPZStream[0x3b])(this,pcVar3,&local_38);
    sVar4 = local_38;
    memcpy(pcVar3 + local_38,source,*nBytes);
    if (this->fBuffer != (char *)0x0) {
      operator_delete__(this->fBuffer);
      sVar4 = local_38;
    }
    this->fBuffer = pcVar3;
    this->fNAllocatedBytes = uVar2;
    this->fFirst = pcVar3;
    sVar1 = *nBytes;
    this->fSize = sVar4 + sVar1;
    this->fLast = pcVar3 + ((sVar4 + sVar1) - 1);
  }
  else {
    pcVar3 = this->fLast;
    if (pcVar3 + __n < this->fBuffer + this->fNAllocatedBytes) {
      memcpy(pcVar3 + 1,source,__n);
      pcVar3 = (char *)*nBytes;
      pcVar5 = this->fLast + (long)pcVar3;
    }
    else {
      pcVar5 = this->fBuffer + this->fNAllocatedBytes + ~(ulong)pcVar3;
      memcpy(pcVar3 + 1,source,(size_t)pcVar5);
      pcVar3 = pcVar5;
      if (*nBytes - (long)pcVar5 != 0) {
        memcpy(this->fBuffer,source + (long)pcVar5,*nBytes - (long)pcVar5);
        pcVar3 = (char *)*nBytes;
      }
      pcVar5 = this->fBuffer + (long)pcVar3 + ~(ulong)pcVar5;
    }
    this->fLast = pcVar5;
    this->fSize = (size_t)(pcVar3 + this->fSize);
  }
  return;
}

Assistant:

void TPZCircBufferedStream::WriteToBuffer(const char *source,
                                      const size_t &nBytes) {
    if (fSize + nBytes > fNAllocatedBytes) {
        const size_t oldSize = fSize;
        const size_t newAllocatedBytes =
            oldSize * 1.1 + nBytes +
            MIN_SIZE_INCREMENT; // 10% increase + nBytes + MIN_SIZE_INCREMENT
        char *temp = new char[newAllocatedBytes];
        ConstReadFromBuffer(temp, oldSize);
        memcpy(temp + oldSize, source, nBytes);
        delete[] fBuffer;
        fBuffer = temp;
        fNAllocatedBytes = newAllocatedBytes;
        fFirst = fBuffer;
        fSize = oldSize + nBytes;
        fLast = fBuffer - 1 + fSize;
    } else {
        char *endBuffer = fBuffer + fNAllocatedBytes;

        if (fLast + nBytes < endBuffer) {
            // direct writing (we do not need to cycle to the beginning of the
            // buffer to write)
            memcpy(fLast + 1, source, nBytes);
            fLast += nBytes;
        } else {
            // we need to write past the end of the buffer.
            const size_t nBytesWritten(endBuffer - fLast - 1);
            memcpy(fLast + 1, source, nBytesWritten);
            if (nBytes != nBytesWritten) {
                memcpy(fBuffer, source + nBytesWritten, nBytes - nBytesWritten);
            }
            fLast = fBuffer - 1 + nBytes - nBytesWritten;
        }

        fSize += nBytes;
    }
}